

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * NewDocTypeNode(TidyDocImpl *doc)

{
  Node *element;
  Node *node;
  
  element = prvTidyFindHTML(doc);
  if (element == (Node *)0x0) {
    node = (Node *)0x0;
  }
  else {
    node = (Node *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x70);
    node->type = RootNode;
    node->line = 0;
    node->column = 0;
    node->idx = 0;
    node->parent = (Node *)0x0;
    node->prev = (Node *)0x0;
    node->next = (Node *)0x0;
    node->content = (Node *)0x0;
    node->last = (Node *)0x0;
    node->attributes = (AttVal *)0x0;
    node->was = (Dict *)0x0;
    node->tag = (Dict *)0x0;
    node->element = (tmbstr)0x0;
    node->start = 0;
    node->end = 0;
    node->closed = no;
    node->implicit = no;
    *(undefined8 *)&node->linebreak = 0;
    node->type = DocTypeTag;
    prvTidyInsertNodeBeforeElement(element,node);
  }
  return node;
}

Assistant:

static Node* NewDocTypeNode( TidyDocImpl* doc )
{
    Node* doctype = NULL;
    Node* html = TY_(FindHTML)( doc );

    if ( !html )
        return NULL;

    doctype = TY_(NewNode)( doc->allocator, NULL );
    doctype->type = DocTypeTag;
    TY_(InsertNodeBeforeElement)(html, doctype);
    return doctype;
}